

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linde_buzo_gray_algorithm.cc
# Opt level: O3

bool __thiscall
sptk::LindeBuzoGrayAlgorithm::Run
          (LindeBuzoGrayAlgorithm *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,
          double *total_distance)

{
  StatisticsAccumulation *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> *this_01;
  ulong uVar10;
  double dVar11;
  pointer pvVar12;
  int index;
  double random_value;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  buffers;
  NormalDistributedRandomValueGeneration random_value_generation;
  int local_10c;
  undefined8 local_108;
  pointer local_100;
  StatisticsAccumulation *local_f8;
  int local_f0;
  int local_ec;
  ulong local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  pointer local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  long local_b8;
  ulong local_b0;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  local_a8;
  double local_90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_88;
  ulong local_80;
  DistanceCalculation *local_78;
  VectorQuantization *local_70;
  NormalDistributedRandomValueGeneration local_68;
  
  if (this->is_valid_ == true) {
    if (total_distance == (double *)0x0) {
      return false;
    }
    if (codebook_indices == (vector<int,_std::allocator<int>_> *)0x0) {
      return false;
    }
    if (codebook_vectors ==
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0) {
      return false;
    }
    lVar6 = ((long)(input_vectors->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(input_vectors->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    iVar2 = this->target_codebook_size_;
    uVar5 = (uint)lVar6;
    if ((int)uVar5 < this->min_num_vector_in_cluster_ * iVar2) {
      return false;
    }
    if (((long)(codebook_vectors->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(codebook_vectors->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        (long)this->initial_codebook_size_ == 0) {
      local_e0 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)total_distance;
      if ((long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != (long)(int)uVar5) {
        std::vector<int,_std::allocator<int>_>::resize(codebook_indices,(long)(int)uVar5);
        iVar2 = this->target_codebook_size_;
      }
      std::
      vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
      ::vector(&local_a8,(long)iVar2,(allocator_type *)&local_68);
      NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
                (&local_68,this->seed_);
      (local_e0->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x7fefffffffffffff;
      uVar3 = this->initial_codebook_size_ * 2;
      if ((int)uVar3 <= this->target_codebook_size_) {
        local_f8 = &this->statistics_accumulation_;
        local_70 = &this->vector_quantization_;
        local_78 = &this->distance_calculation_;
        local_90 = (double)(int)uVar5;
        local_80 = (ulong)(uVar5 & 0x7fffffff);
        uVar8 = (ulong)(uint)this->initial_codebook_size_;
        local_b8 = lVar6;
        do {
          local_e8 = (ulong)uVar3;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize(codebook_vectors,(long)(int)uVar3);
          for (this_01 = (codebook_vectors->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + (int)uVar8;
              this_01 !=
              (codebook_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
            std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->num_order_ + 1)
            ;
          }
          if (0 < (int)uVar8) {
            uVar10 = (ulong)(uint)this->num_order_;
            uVar7 = 0;
            local_c8 = uVar8 & 0xffffffff;
            local_c0 = codebook_indices;
            local_88 = input_vectors;
            do {
              if (-1 < (int)uVar10) {
                lVar6 = -1;
                do {
                  bVar1 = NormalDistributedRandomValueGeneration::Get
                                    (&local_68,(double *)&local_108);
                  if (!bVar1) goto LAB_001111e0;
                  dVar11 = this->splitting_factor_ *
                           (double)CONCAT44(local_108._4_4_,(int)local_108);
                  pvVar12 = (codebook_vectors->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7;
                  lVar9 = *(long *)&(pvVar12->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data;
                  *(double *)
                   (*(long *)&pvVar12[uVar8 & 0xffffffff].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl + 8 +
                   lVar6 * 8) = *(double *)(lVar9 + 8 + lVar6 * 8) - dVar11;
                  *(double *)(lVar9 + 8 + lVar6 * 8) = dVar11 + *(double *)(lVar9 + 8 + lVar6 * 8);
                  uVar10 = (ulong)this->num_order_;
                  lVar6 = lVar6 + 1;
                  codebook_indices = local_c0;
                  input_vectors = local_88;
                } while (lVar6 < (long)uVar10);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != local_c8);
          }
          if (0 < this->num_iteration_) {
            local_b0 = local_e8 & 0xffffffff;
            local_c8 = local_b0 << 7;
            local_f0 = 0;
            pvVar12 = (pointer)0x7fefffffffffffff;
            do {
              this_00 = local_f8;
              uStack_d0 = 0;
              local_d8 = pvVar12;
              if (0 < (int)local_e8) {
                uVar8 = 0;
                do {
                  StatisticsAccumulation::Clear
                            (this_00,(Buffer *)
                                     ((long)&(local_a8.
                                              super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _vptr_Buffer + uVar8));
                  uVar8 = uVar8 + 0x80;
                } while (local_c8 != uVar8);
              }
              if ((int)local_b8 < 1) {
                local_100 = (pointer)0x0;
              }
              else {
                local_100 = (pointer)0x0;
                lVar6 = 0;
                uVar8 = 0;
                do {
                  bVar1 = VectorQuantization::Run
                                    (local_70,(vector<double,_std::allocator<double>_> *)
                                              ((long)&(((input_vectors->
                                                                                                                
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar6),
                                     codebook_vectors,&local_10c);
                  if (!bVar1) goto LAB_001111e0;
                  (codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar8] = local_10c;
                  bVar1 = StatisticsAccumulation::Run
                                    (local_f8,(vector<double,_std::allocator<double>_> *)
                                              ((long)&(((input_vectors->
                                                                                                                
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar6),
                                     local_a8.
                                     super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_10c);
                  if ((!bVar1) ||
                     (bVar1 = DistanceCalculation::Run
                                        (local_78,(vector<double,_std::allocator<double>_> *)
                                                  ((long)&(((input_vectors->
                                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar6),
                                         (codebook_vectors->
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + local_10c,
                                         (double *)&local_108), !bVar1)) goto LAB_001111e0;
                  local_100 = (pointer)((double)local_100 +
                                       (double)CONCAT44(local_108._4_4_,(int)local_108));
                  uVar8 = uVar8 + 1;
                  lVar6 = lVar6 + 0x18;
                } while (local_80 != uVar8);
              }
              pvVar12 = (pointer)((double)local_100 / local_90);
              (local_e0->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start = pvVar12;
              if ((((double)pvVar12 == 0.0) && (!NAN((double)pvVar12))) ||
                 (ABS((double)local_d8 - (double)pvVar12) / (double)pvVar12 <
                  this->convergence_threshold_)) break;
              local_100 = pvVar12;
              if (0 < (int)local_e8) {
                local_d8 = (pointer)CONCAT44(local_d8._4_4_,0xffffffff);
                uVar8 = 0;
                local_ec = 0;
                do {
                  bVar1 = StatisticsAccumulation::GetNumData
                                    (local_f8,local_a8.
                                              super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar8,
                                     (int *)&local_108);
                  if (!bVar1) goto LAB_001111e0;
                  uVar4 = (int)local_d8;
                  if (local_ec < (int)local_108) {
                    uVar4 = (undefined4)uVar8;
                  }
                  local_d8 = (pointer)CONCAT44(local_d8._4_4_,uVar4);
                  if (local_ec <= (int)local_108) {
                    local_ec = (int)local_108;
                  }
                  if ((this->min_num_vector_in_cluster_ <= (int)local_108) &&
                     (bVar1 = StatisticsAccumulation::GetMean
                                        (local_f8,local_a8.
                                                  super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar8,
                                         (codebook_vectors->
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar8), !bVar1
                     )) goto LAB_001111e0;
                  uVar8 = uVar8 + 1;
                } while (uVar8 != local_b0);
                if (0 < (int)local_e8) {
                  local_d8 = (pointer)(long)(int)local_d8;
                  uVar8 = 0;
                  do {
                    bVar1 = StatisticsAccumulation::GetNumData
                                      (local_f8,local_a8.
                                                super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar8,
                                       &local_10c);
                    if (!bVar1) goto LAB_001111e0;
                    if ((local_10c < this->min_num_vector_in_cluster_) && (-1 < this->num_order_)) {
                      lVar6 = -1;
                      do {
                        bVar1 = NormalDistributedRandomValueGeneration::Get
                                          (&local_68,(double *)&local_108);
                        if (!bVar1) goto LAB_001111e0;
                        dVar11 = this->splitting_factor_ *
                                 (double)CONCAT44(local_108._4_4_,(int)local_108);
                        pvVar12 = (codebook_vectors->
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        lVar9 = *(long *)&pvVar12[(long)local_d8].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data;
                        *(double *)
                         (*(long *)&pvVar12[uVar8].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8 + lVar6 * 8) =
                             *(double *)(lVar9 + 8 + lVar6 * 8) - dVar11;
                        *(double *)(lVar9 + 8 + lVar6 * 8) =
                             dVar11 + *(double *)(lVar9 + 8 + lVar6 * 8);
                        lVar6 = lVar6 + 1;
                      } while (lVar6 < this->num_order_);
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar8 != local_b0);
                }
              }
              local_f0 = local_f0 + 1;
              pvVar12 = local_100;
            } while (local_f0 < this->num_iteration_);
          }
          uVar3 = (int)local_e8 * 2;
          uVar8 = local_e8;
          lVar6 = local_b8;
        } while ((int)uVar3 <= this->target_codebook_size_);
      }
      if ((int)(uint)lVar6 < 1) {
        bVar1 = true;
      }
      else {
        uVar8 = (ulong)((uint)lVar6 & 0x7fffffff);
        lVar6 = 0;
        lVar9 = 0;
        uVar10 = 0;
        local_e0 = codebook_vectors;
        local_c0 = codebook_indices;
        do {
          bVar1 = VectorQuantization::Run
                            (&this->vector_quantization_,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&(((input_vectors->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar9),local_e0,
                             (int *)((long)(local_c0->super__Vector_base<int,_std::allocator<int>_>)
                                           ._M_impl.super__Vector_impl_data._M_start + lVar6));
          if (!bVar1) goto LAB_001111e0;
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x18;
          lVar6 = lVar6 + 4;
        } while (uVar8 != uVar10);
        bVar1 = uVar8 <= uVar10;
      }
      goto LAB_001111e7;
    }
  }
  return false;
LAB_001111e0:
  bVar1 = false;
LAB_001111e7:
  std::
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  ::~vector(&local_a8);
  return bVar1;
}

Assistant:

bool LindeBuzoGrayAlgorithm::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<std::vector<double> >* codebook_vectors,
    std::vector<int>* codebook_indices, double* total_distance) const {
  // Check inputs.
  const int num_input_vector(static_cast<int>(input_vectors.size()));
  if (!is_valid_ ||
      num_input_vector < min_num_vector_in_cluster_ * target_codebook_size_ ||
      NULL == codebook_vectors || NULL == codebook_indices ||
      NULL == total_distance ||
      codebook_vectors->size() !=
          static_cast<std::size_t>(initial_codebook_size_)) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_input_vector)) {
    codebook_indices->resize(num_input_vector);
  }
  std::vector<StatisticsAccumulation::Buffer> buffers(target_codebook_size_);

  // Prepare random value generator.
  NormalDistributedRandomValueGeneration random_value_generation(seed_);

  *total_distance = sptk::kMax;

  // Design codebook.
  int current_codebook_size(initial_codebook_size_);
  for (int next_codebook_size(current_codebook_size * 2);
       next_codebook_size <= target_codebook_size_; next_codebook_size *= 2) {
    // Double codebook size.
    codebook_vectors->resize(next_codebook_size);
    for (std::vector<std::vector<double> >::iterator itr(
             codebook_vectors->begin() + current_codebook_size);
         itr != codebook_vectors->end(); ++itr) {
      itr->resize(num_order_ + 1);
    }

    // Perturb codebook vectors.
    for (int i(0); i < current_codebook_size; ++i) {
      for (int m(0); m <= num_order_; ++m) {
        double random_value;
        if (!random_value_generation.Get(&random_value)) {
          return false;
        }
        const double perturbation(splitting_factor_ * random_value);
        const int j(i + current_codebook_size);
        (*codebook_vectors)[j][m] = (*codebook_vectors)[i][m] - perturbation;
        (*codebook_vectors)[i][m] = (*codebook_vectors)[i][m] + perturbation;
      }
    }

    current_codebook_size = next_codebook_size;

    double prev_total_distance(sptk::kMax);
    for (int n(0); n < num_iteration_; ++n) {
      // Initialize.
      double sum(0.0);
      for (int i(0); i < current_codebook_size; ++i) {
        statistics_accumulation_.Clear(&(buffers[i]));
      }

      // Accumulate statistics (E-step).
      for (int t(0); t < num_input_vector; ++t) {
        int index;
        if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                      &index)) {
          return false;
        }
        (*codebook_indices)[t] = index;

        if (!statistics_accumulation_.Run(input_vectors[t],
                                          &(buffers[index]))) {
          return false;
        }

        double distance;
        if (!distance_calculation_.Run(input_vectors[t],
                                       (*codebook_vectors)[index], &distance)) {
          return false;
        }
        sum += distance;
      }
      *total_distance = sum / num_input_vector;

      // Check convergence.
      const double criterion_value(
          std::fabs(prev_total_distance - *total_distance) / *total_distance);
      if (0.0 == *total_distance || criterion_value < convergence_threshold_) {
        break;
      }
      prev_total_distance = *total_distance;

      // Update codebook (M-step) and find a maximum cluster.
      int majority_index(-1);
      int max_num_vector_in_cluster(0);
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (max_num_vector_in_cluster < num_vector) {
          majority_index = i;
          max_num_vector_in_cluster = num_vector;
        }

        // Update if the cluster contains enough data.
        if (min_num_vector_in_cluster_ <= num_vector) {
          if (!statistics_accumulation_.GetMean(buffers[i],
                                                &((*codebook_vectors)[i]))) {
            return false;
          }
        }
      }

      // Update the remaining centroids.
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (num_vector < min_num_vector_in_cluster_) {
          for (int m(0); m <= num_order_; ++m) {
            double random_value;
            if (!random_value_generation.Get(&random_value)) {
              return false;
            }
            const double perturbation(splitting_factor_ * random_value);
            const int j(majority_index);
            (*codebook_vectors)[i][m] =
                (*codebook_vectors)[j][m] - perturbation;
            (*codebook_vectors)[j][m] =
                (*codebook_vectors)[j][m] + perturbation;
          }
        }
      }
    }
  }

  // Save final results.
  for (int t(0); t < num_input_vector; ++t) {
    if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                  &((*codebook_indices)[t]))) {
      return false;
    }
  }

  return true;
}